

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

boolean is_chargeable(obj *obj)

{
  char cVar1;
  
  cVar1 = obj->oclass;
  if (cVar1 == '\v') {
    return '\x01';
  }
  if (cVar1 == '\x06') {
    if (objects[obj->otyp].oc_subtyp == '\0') {
      return (ushort)(obj->otyp - 0xe7U) < 3 | (objects[obj->otyp].field_0x10 & 0x20) >> 5;
    }
  }
  else if ((cVar1 == '\x04') && ((objects[obj->otyp].field_0x10 & 0x20) != 0)) {
    if ((obj->field_0x4a & 0x10) != 0) {
      return '\x01';
    }
    return objects[obj->otyp].oc_uname != (char *)0x0;
  }
  return '\0';
}

Assistant:

boolean is_chargeable(struct obj *obj)
{
	if (obj->oclass == WAND_CLASS) return TRUE;
	/* known && !uname is possible after amnesia/mind flayer */
	if (obj->oclass == RING_CLASS)
	    return (boolean)(objects[obj->otyp].oc_charged &&
			(obj->known || objects[obj->otyp].oc_uname));
	if (is_weptool(obj))	/* specific check before general tools */
	    return FALSE;
	/* Magic lamps can't be recharged, but they should be listed
	 * to prevent telling them apart from oil lamps with charging.
	 */
	if (obj->oclass == TOOL_CLASS) {
	    return (boolean)(objects[obj->otyp].oc_charged ||
			     obj->otyp == BRASS_LANTERN ||
			     obj->otyp == OIL_LAMP ||
			     obj->otyp == MAGIC_LAMP);
	}
	return FALSE; /* why are weapons/armor considered charged anyway? */
}